

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupNamespaceURI(DOMNodeImpl *this,XMLCh *specifiedPrefix)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  long *plVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNode *pDVar9;
  undefined4 extraout_var_05;
  DOMNode *local_a0;
  DOMNode *ancestor_1;
  DOMNode *ancestor;
  XMLCh *value;
  XMLCh *attrPrefix;
  DOMNode *attr;
  XMLSize_t i;
  XMLSize_t length;
  DOMNamedNodeMap *nodeMap;
  XMLCh *prefix;
  XMLCh *ns;
  short type;
  DOMNode *thisNode;
  XMLCh *specifiedPrefix_local;
  DOMNodeImpl *this_local;
  undefined4 extraout_var_01;
  
  local_a0 = getContainingNode(this);
  iVar2 = (*local_a0->_vptr_DOMNode[4])();
  switch((short)iVar2) {
  case 1:
    iVar2 = (*local_a0->_vptr_DOMNode[0x16])();
    this_local = (DOMNodeImpl *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*local_a0->_vptr_DOMNode[0x17])();
    pXVar6 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    if ((this_local == (DOMNodeImpl *)0x0) ||
       (((specifiedPrefix != (XMLCh *)0x0 || (pXVar6 != (XMLCh *)0x0)) &&
        ((pXVar6 == (XMLCh *)0x0 || (bVar1 = XMLString::equals(pXVar6,specifiedPrefix), !bVar1))))))
    {
      uVar3 = (*local_a0->_vptr_DOMNode[0x1a])();
      if ((uVar3 & 1) != 0) {
        iVar2 = (*local_a0->_vptr_DOMNode[0xb])();
        plVar4 = (long *)CONCAT44(extraout_var_01,iVar2);
        if (plVar4 != (long *)0x0) {
          pDVar9 = (DOMNode *)(**(code **)(*plVar4 + 0x28))();
          for (attr = (DOMNode *)0x0; attr < pDVar9;
              attr = (DOMNode *)((long)&attr->_vptr_DOMNode + 1)) {
            plVar5 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,attr);
            pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb8))();
            pXVar7 = (XMLCh *)(**(code **)(*plVar5 + 0x18))();
            pXVar8 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))();
            if ((pXVar8 != (XMLCh *)0x0) &&
               (bVar1 = XMLString::equals(pXVar8,(XMLCh *)XMLUni::fgXMLNSURIName), bVar1)) {
              if (specifiedPrefix == (XMLCh *)0x0) {
                pXVar8 = (XMLCh *)(**(code **)(*plVar5 + 0x10))();
                bVar1 = XMLString::equals(pXVar8,(XMLCh *)XMLUni::fgXMLNSString);
                if (bVar1) {
                  return pXVar7;
                }
              }
              if ((pXVar6 != (XMLCh *)0x0) &&
                 (bVar1 = XMLString::equals(pXVar6,(XMLCh *)XMLUni::fgXMLNSString), bVar1)) {
                pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xc0))();
                bVar1 = XMLString::equals(pXVar6,specifiedPrefix);
                if (bVar1) {
                  return pXVar7;
                }
              }
            }
          }
        }
      }
      pDVar9 = getElementAncestor(this,local_a0);
      if (pDVar9 == (DOMNode *)0x0) {
        this_local = (DOMNodeImpl *)0x0;
      }
      else {
        iVar2 = (*pDVar9->_vptr_DOMNode[0x25])(pDVar9,specifiedPrefix);
        this_local = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar2);
      }
    }
    break;
  case 2:
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar2 == 1) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0x25])(this->fOwnerNode,specifiedPrefix);
      this_local = (DOMNodeImpl *)CONCAT44(extraout_var_04,iVar2);
    }
    else {
      this_local = (DOMNodeImpl *)0x0;
    }
    break;
  default:
    pDVar9 = getContainingNode(this);
    pDVar9 = getElementAncestor(this,pDVar9);
    if (pDVar9 == (DOMNode *)0x0) {
      this_local = (DOMNodeImpl *)0x0;
    }
    else {
      iVar2 = (*pDVar9->_vptr_DOMNode[0x25])(pDVar9,specifiedPrefix);
      this_local = (DOMNodeImpl *)CONCAT44(extraout_var_05,iVar2);
    }
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    this_local = (DOMNodeImpl *)0x0;
    break;
  case 9:
    if (local_a0 == (DOMNode *)0x0) {
      local_a0 = (DOMNode *)0x0;
    }
    else {
      local_a0 = local_a0 + -3;
    }
    iVar2 = (*local_a0->_vptr_DOMNode[0xd])();
    this_local = (DOMNodeImpl *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x128))
                           ((long *)CONCAT44(extraout_var_03,iVar2),specifiedPrefix);
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* DOMNodeImpl::lookupNamespaceURI(const XMLCh* specifiedPrefix) const  {
    const DOMNode *thisNode = getContainingNode();

    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE : {
        const XMLCh* ns = thisNode->getNamespaceURI();
        const XMLCh* prefix = thisNode->getPrefix();
        if (ns != 0) {
            // REVISIT: is it possible that prefix is empty string?
            if (specifiedPrefix == 0 && prefix == specifiedPrefix) {
                // looking for default namespace
                return ns;
            } else if (prefix != 0 && XMLString::equals(prefix, specifiedPrefix)) {
                // non default namespace
                return ns;
            }
        }
        if (thisNode->hasAttributes()) {
            DOMNamedNodeMap *nodeMap = thisNode->getAttributes();
            if(nodeMap != 0) {
                XMLSize_t length = nodeMap->getLength();
                for (XMLSize_t i = 0;i < length;i++) {
                    DOMNode *attr = nodeMap->item(i);
                    const XMLCh *attrPrefix = attr->getPrefix();
                    const XMLCh *value = attr->getNodeValue();
                    ns = attr->getNamespaceURI();

                    if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                        // at this point we are dealing with DOM Level 2 nodes only
                        if (specifiedPrefix == 0 &&
                            XMLString::equals(attr->getNodeName(), XMLUni::fgXMLNSString)) {
                            // default namespace
                            return value;
                        } else if (attrPrefix != 0 &&
                                   XMLString::equals(attrPrefix, XMLUni::fgXMLNSString) &&
                                   XMLString::equals(attr->getLocalName(), specifiedPrefix)) {
                            // non default namespace
                            return value;
                        }
                    }
                }
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    case DOMNode::DOCUMENT_NODE : {
        return((DOMDocument*)thisNode)->getDocumentElement()->lookupNamespaceURI(specifiedPrefix);
    }
    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return 0;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(getContainingNode());
        if (ancestor != 0) {
            return ancestor->lookupNamespaceURI(specifiedPrefix);
        }
        return 0;
    }
    }
}